

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,slang::parsing::Token>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,slang::detail::hashing::StackAllocator<std::pair<slang::parsing::TokenKind_const,slang::parsing::Token>,96ul,16ul>>
::
nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind&,slang::parsing::Token&>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,slang::parsing::Token>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,slang::detail::hashing::StackAllocator<std::pair<slang::parsing::TokenKind_const,slang::parsing::Token>,96ul,16ul>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,try_emplace_args_t *args,
          TokenKind *args_1,Token *args_2)

{
  group_type_pointer pgVar1;
  value_type_pointer ppVar2;
  group_type_pointer pgVar3;
  ulong uVar4;
  uint uVar5;
  ushort uVar6;
  Info *pIVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  pgVar3 = arrays_->groups_;
  lVar11 = pos0 * 0x10;
  pgVar1 = pgVar3 + pos0;
  auVar14[0] = -(pgVar1->m[0].n == '\0');
  auVar14[1] = -(pgVar1->m[1].n == '\0');
  auVar14[2] = -(pgVar1->m[2].n == '\0');
  auVar14[3] = -(pgVar1->m[3].n == '\0');
  auVar14[4] = -(pgVar1->m[4].n == '\0');
  auVar14[5] = -(pgVar1->m[5].n == '\0');
  auVar14[6] = -(pgVar1->m[6].n == '\0');
  auVar14[7] = -(pgVar1->m[7].n == '\0');
  auVar14[8] = -(pgVar1->m[8].n == '\0');
  auVar14[9] = -(pgVar1->m[9].n == '\0');
  auVar14[10] = -(pgVar1->m[10].n == '\0');
  auVar14[0xb] = -(pgVar1->m[0xb].n == '\0');
  auVar14[0xc] = -(pgVar1->m[0xc].n == '\0');
  auVar14[0xd] = -(pgVar1->m[0xd].n == '\0');
  auVar14[0xe] = -(pgVar1->m[0xe].n == '\0');
  auVar14[0xf] = -(pgVar1->m[0xf].n == '\0');
  uVar12 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
  if (uVar12 == 0) {
    uVar4 = arrays_->groups_size_mask;
    lVar13 = 1;
    do {
      pgVar3[pos0].m[0xf].n = pgVar3[pos0].m[0xf].n | '\x01' << ((byte)hash & 7);
      pos0 = pos0 + lVar13 & uVar4;
      lVar11 = pos0 * 0x10;
      pgVar1 = pgVar3 + pos0;
      auVar15[0] = -(pgVar1->m[0].n == '\0');
      auVar15[1] = -(pgVar1->m[1].n == '\0');
      auVar15[2] = -(pgVar1->m[2].n == '\0');
      auVar15[3] = -(pgVar1->m[3].n == '\0');
      auVar15[4] = -(pgVar1->m[4].n == '\0');
      auVar15[5] = -(pgVar1->m[5].n == '\0');
      auVar15[6] = -(pgVar1->m[6].n == '\0');
      auVar15[7] = -(pgVar1->m[7].n == '\0');
      auVar15[8] = -(pgVar1->m[8].n == '\0');
      auVar15[9] = -(pgVar1->m[9].n == '\0');
      auVar15[10] = -(pgVar1->m[10].n == '\0');
      auVar15[0xb] = -(pgVar1->m[0xb].n == '\0');
      auVar15[0xc] = -(pgVar1->m[0xc].n == '\0');
      auVar15[0xd] = -(pgVar1->m[0xd].n == '\0');
      auVar15[0xe] = -(pgVar1->m[0xe].n == '\0');
      auVar15[0xf] = -(pgVar1->m[0xf].n == '\0');
      uVar6 = (ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe;
      uVar12 = (uint)uVar6;
      lVar13 = lVar13 + 1;
    } while (uVar6 == 0);
  }
  uVar5 = 0;
  if (uVar12 != 0) {
    for (; (uVar12 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
    }
  }
  ppVar2 = arrays_->elements_ + pos0 * 0xf + (ulong)uVar5;
  ppVar2->first = *args_1;
  uVar8 = args_2->field_0x2;
  NVar9.raw = (args_2->numFlags).raw;
  uVar10 = args_2->rawLen;
  pIVar7 = args_2->info;
  (ppVar2->second).kind = args_2->kind;
  (ppVar2->second).field_0x2 = uVar8;
  (ppVar2->second).numFlags = (NumericTokenFlags)NVar9.raw;
  (ppVar2->second).rawLen = uVar10;
  (ppVar2->second).info = pIVar7;
  (pgVar3->m + lVar11)[uVar5].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + ((uint)hash & 0xff));
  __return_storage_ptr__->pg =
       (group15<boost::unordered::detail::foa::plain_integral> *)(pgVar3->m + lVar11);
  __return_storage_ptr__->n = uVar5;
  __return_storage_ptr__->p = ppVar2;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }